

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy_dedicatedDictSearch_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  ZSTD_matchState_t *pZVar2;
  U32 *pUVar3;
  seqDef *psVar4;
  bool bVar5;
  U32 UVar6;
  char cVar7;
  undefined8 uVar8;
  seqStore_t *psVar9;
  uint uVar10;
  uint uVar11;
  size_t sVar12;
  ulong uVar13;
  int *piVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  int *mEnd;
  BYTE *pBVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  int *iEnd;
  ulong uVar22;
  BYTE *pBVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  int *piVar28;
  int *piVar29;
  size_t ofbCandidate;
  size_t local_100;
  uint local_f8;
  uint local_f4;
  ZSTD_matchState_t *local_f0;
  BYTE *local_e8;
  uint local_dc;
  int *local_d8;
  int *local_d0;
  uint local_c8;
  uint local_c4;
  ulong local_c0;
  seqStore_t *local_b8;
  ulong local_b0;
  int *local_a8;
  int *local_a0;
  BYTE *local_98;
  uint *local_90;
  BYTE *local_88;
  uint local_7c;
  int *local_78;
  BYTE *local_70;
  BYTE *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_e8 = (ms->window).base;
  local_c4 = (ms->cParams).minMatch;
  if (5 < local_c4) {
    local_c4 = 6;
  }
  if (local_c4 < 5) {
    local_c4 = 4;
  }
  local_c8 = (ms->cParams).searchLog;
  local_f8 = 6;
  if (local_c8 < 6) {
    local_f8 = local_c8;
  }
  uVar11 = (ms->window).dictLimit;
  local_c0 = (ulong)uVar11;
  if (local_f8 < 5) {
    local_f8 = 4;
  }
  local_98 = local_e8 + local_c0;
  pZVar2 = ms->dictMatchState;
  local_88 = (pZVar2->window).base;
  local_68 = local_88 + (pZVar2->window).dictLimit;
  local_a0 = (int *)(pZVar2->window).nextSrc;
  iVar20 = (int)local_a0;
  uVar10 = ((int)src - ((int)local_68 + (int)local_98)) + iVar20;
  piVar29 = (int *)((long)src + (ulong)(uVar10 == 0));
  local_f4 = *rep;
  local_d0 = (int *)src;
  if (uVar10 < local_f4) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7977,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  uVar17 = rep[1];
  local_dc = uVar17;
  local_b8 = seqStore;
  local_90 = rep;
  if (uVar10 < uVar17) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7978,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_a8 = (int *)((long)src + (srcSize - 0x10));
  ms->lazySkipping = 0;
  uVar10 = ms->nextToUpdate;
  uVar22 = (ulong)uVar10;
  uVar19 = ((int)local_a8 - (int)(local_e8 + uVar22)) + 1;
  uVar21 = 8;
  if (uVar19 < 8) {
    uVar21 = uVar19;
  }
  if (local_a8 < local_e8 + uVar22) {
    uVar21 = 0;
  }
  bVar15 = (byte)local_f8;
  local_f0 = ms;
  if (uVar10 < uVar21 + uVar10) {
    if (0x20 < ms->rowHashLog + 8) {
LAB_0016b0bf:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar3 = ms->hashTable;
    pBVar23 = ms->tagTable;
    uVar13 = ms->hashSalt;
    cVar7 = (char)ms->rowHashLog;
    do {
      if (local_c4 == 5) {
        uVar25 = *(long *)(local_e8 + uVar22) * -0x30e4432345000000;
LAB_0016a590:
        uVar19 = (uint)((uVar25 ^ uVar13) >> (0x38U - cVar7 & 0x3f));
      }
      else {
        if (local_c4 == 6) {
          uVar25 = *(long *)(local_e8 + uVar22) * -0x30e4432340650000;
          goto LAB_0016a590;
        }
        uVar19 = (*(int *)(local_e8 + uVar22) * -0x61c8864f ^ (uint)uVar13) >>
                 (0x18U - cVar7 & 0x1f);
      }
      uVar27 = (uVar19 >> 8) << (bVar15 & 0x1f);
      if (((ulong)(pUVar3 + uVar27) & 0x3f) != 0) {
LAB_0016afc7:
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a2,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar23 + uVar27) & ~(-1L << (bVar15 & 0x3f))) != 0) {
LAB_0016afa8:
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a3,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar22 & 7] = uVar19;
      uVar22 = uVar22 + 1;
    } while (uVar21 + uVar10 != uVar22);
  }
  iEnd = (int *)(srcSize + (long)src);
  if (piVar29 < local_a8) {
    local_7c = ((int)local_88 - iVar20) + uVar11;
    local_70 = local_88 + -(ulong)local_7c;
    local_78 = iEnd + -8;
    local_48 = ~(-1L << (bVar15 & 0x3f));
    iVar16 = (int)local_e8;
    local_50 = (ulong)((1 - uVar11) - iVar16);
    local_58 = (ulong)(uint)-iVar16;
    local_60 = (ulong)((((iVar20 - uVar11) - (int)local_88) - iVar16) + 1);
    do {
      local_d8 = (int *)((long)piVar29 + 1);
      iVar20 = (int)piVar29;
      uVar11 = ((iVar20 - (int)local_e8) - local_f4) + 1;
      piVar14 = (int *)(local_e8 + uVar11);
      if (uVar11 < (uint)local_c0) {
        piVar14 = (int *)(local_88 + (uVar11 - local_7c));
      }
      local_dc = uVar17;
      if ((uVar11 - (uint)local_c0 < 0xfffffffd) && (*piVar14 == *local_d8)) {
        piVar28 = iEnd;
        if (uVar11 < (uint)local_c0) {
          piVar28 = local_a0;
        }
        sVar12 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar29 + 5),(BYTE *)(piVar14 + 1),(BYTE *)iEnd,
                            (BYTE *)piVar28,local_98);
        uVar22 = sVar12 + 4;
      }
      else {
        uVar22 = 0;
      }
      local_100 = 999999999;
      if (local_c4 == 6) {
        if (local_f8 == 6) {
          uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                             (ms,(BYTE *)piVar29,(BYTE *)iEnd,&local_100);
        }
        else if (local_f8 == 5) {
          uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                             (ms,(BYTE *)piVar29,(BYTE *)iEnd,&local_100);
        }
        else {
          uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                             (ms,(BYTE *)piVar29,(BYTE *)iEnd,&local_100);
        }
      }
      else if (local_c4 == 5) {
        if (local_f8 == 6) {
          uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                             (ms,(BYTE *)piVar29,(BYTE *)iEnd,&local_100);
        }
        else if (local_f8 == 5) {
          uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                             (ms,(BYTE *)piVar29,(BYTE *)iEnd,&local_100);
        }
        else {
          uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                             (ms,(BYTE *)piVar29,(BYTE *)iEnd,&local_100);
        }
      }
      else if (local_f8 == 6) {
        uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                           (ms,(BYTE *)piVar29,(BYTE *)iEnd,&local_100);
      }
      else if (local_f8 == 5) {
        uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                           (ms,(BYTE *)piVar29,(BYTE *)iEnd,&local_100);
      }
      else {
        uVar13 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                           (ms,(BYTE *)piVar29,(BYTE *)iEnd,&local_100);
      }
      uVar25 = uVar22;
      if (uVar22 < uVar13) {
        uVar25 = uVar13;
      }
      if (uVar25 < 4) {
        uVar22 = (long)piVar29 - (long)local_d0;
        piVar29 = (int *)((long)piVar29 + (uVar22 >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < uVar22);
        rep = local_90;
        uVar17 = local_dc;
      }
      else {
        piVar14 = piVar29;
        local_b0 = local_100;
        if (uVar13 <= uVar22) {
          local_b0 = 1;
          piVar14 = local_d8;
        }
        local_38 = (ulong)(((int)local_50 + iVar20) - local_f4);
        local_40 = (ulong)(((int)local_58 + iVar20) - local_f4);
        iVar20 = ((int)local_60 + iVar20) - local_f4;
        lVar26 = 0;
        local_d8 = piVar14;
        do {
          if (local_a8 <= (int *)((long)piVar29 + lVar26)) break;
          piVar28 = (int *)((long)piVar29 + lVar26 + 1);
          iVar16 = (int)lVar26;
          uVar11 = (int)local_40 + iVar16 + 1;
          piVar14 = (int *)(local_e8 + uVar11);
          if (uVar11 < (uint)local_c0) {
            piVar14 = (int *)(local_88 + (uint)(iVar20 + iVar16));
          }
          if (((uint)((int)local_38 + iVar16) < 0xfffffffd) && (*piVar14 == *piVar28)) {
            mEnd = iEnd;
            if (uVar11 < (uint)local_c0) {
              mEnd = local_a0;
            }
            sVar12 = ZSTD_count_2segments
                               ((BYTE *)((long)piVar29 + lVar26 + 5),(BYTE *)(piVar14 + 1),
                                (BYTE *)iEnd,(BYTE *)mEnd,local_98);
            if (sVar12 < 0xfffffffffffffffc) {
              uVar11 = 0x1f;
              if ((uint)local_b0 != 0) {
                for (; (uint)local_b0 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                }
              }
              if ((int)((uVar11 ^ 0x1f) + (int)uVar25 * 3 + -0x1e) < (int)(sVar12 + 4) * 3) {
                local_b0 = 1;
                uVar25 = sVar12 + 4;
                local_d8 = piVar28;
              }
            }
          }
          local_100 = 999999999;
          if (local_c4 == 6) {
            if (local_f8 == 6) {
              uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                                 (local_f0,(BYTE *)piVar28,(BYTE *)iEnd,&local_100);
            }
            else if (local_f8 == 5) {
              uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                                 (local_f0,(BYTE *)piVar28,(BYTE *)iEnd,&local_100);
            }
            else {
              uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                                 (local_f0,(BYTE *)piVar28,(BYTE *)iEnd,&local_100);
            }
          }
          else if (local_c4 == 5) {
            if (local_f8 == 6) {
              uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                                 (local_f0,(BYTE *)piVar28,(BYTE *)iEnd,&local_100);
            }
            else if (local_f8 == 5) {
              uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                                 (local_f0,(BYTE *)piVar28,(BYTE *)iEnd,&local_100);
            }
            else {
              uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                                 (local_f0,(BYTE *)piVar28,(BYTE *)iEnd,&local_100);
            }
          }
          else if (local_f8 == 6) {
            uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                               (local_f0,(BYTE *)piVar28,(BYTE *)iEnd,&local_100);
          }
          else if (local_f8 == 5) {
            uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                               (local_f0,(BYTE *)piVar28,(BYTE *)iEnd,&local_100);
          }
          else {
            uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                               (local_f0,(BYTE *)piVar28,(BYTE *)iEnd,&local_100);
          }
          bVar5 = true;
          if (3 < uVar22) {
            uVar11 = 0x1f;
            if ((uint)local_b0 != 0) {
              for (; (uint)local_b0 >> uVar11 == 0; uVar11 = uVar11 - 1) {
              }
            }
            iVar16 = 0x1f;
            if ((uint)local_100 != 0) {
              for (; (uint)local_100 >> iVar16 == 0; iVar16 = iVar16 + -1) {
              }
            }
            if ((int)((uVar11 ^ 0x1f) + (int)uVar25 * 4 + -0x1b) < (int)uVar22 * 4 - iVar16) {
              bVar5 = false;
              local_b0 = local_100;
              uVar25 = uVar22;
              local_d8 = piVar28;
            }
          }
          lVar26 = lVar26 + 1;
        } while (!bVar5);
        ms = local_f0;
        UVar6 = (U32)local_b0;
        uVar11 = local_f4;
        uVar17 = local_dc;
        if (3 < local_b0) {
          uVar22 = (long)local_d8 + (-(long)local_e8 - local_b0) + -0xfffffffd;
          pBVar18 = local_e8;
          pBVar23 = local_98;
          if ((uint)uVar22 < (uint)local_c0) {
            pBVar18 = local_70;
            pBVar23 = local_68;
          }
          if ((local_d0 < local_d8) && (uVar22 = uVar22 & 0xffffffff, pBVar23 < pBVar18 + uVar22)) {
            pBVar18 = pBVar18 + uVar22;
            do {
              piVar29 = (int *)((long)local_d8 + -1);
              pBVar18 = pBVar18 + -1;
              if ((*(BYTE *)piVar29 != *pBVar18) ||
                 (uVar25 = uVar25 + 1, local_d8 = piVar29, piVar29 <= local_d0)) break;
            } while (pBVar23 < pBVar18);
          }
          uVar11 = UVar6 - 3;
          uVar17 = local_f4;
        }
        local_f4 = uVar11;
        if (local_b8->maxNbSeq <=
            (ulong)((long)local_b8->sequences - (long)local_b8->sequencesStart >> 3)) {
LAB_0016afe6:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_b8->maxNbLit) {
LAB_0016b005:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar22 = (long)local_d8 - (long)local_d0;
        pBVar23 = local_b8->lit;
        if (local_b8->litStart + local_b8->maxNbLit < pBVar23 + uVar22) {
LAB_0016b062:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < local_d8) {
LAB_0016b043:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_78 < local_d8) {
          ZSTD_safecopyLiterals(pBVar23,(BYTE *)local_d0,(BYTE *)local_d8,(BYTE *)local_78);
        }
        else {
          uVar8 = *(undefined8 *)(local_d0 + 2);
          *(undefined8 *)pBVar23 = *(undefined8 *)local_d0;
          *(undefined8 *)(pBVar23 + 8) = uVar8;
          if (0x10 < uVar22) {
            pBVar23 = local_b8->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar23 + 0x10 + (-0x10 - (long)(local_d0 + 4))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar8 = *(undefined8 *)(local_d0 + 6);
            *(undefined8 *)(pBVar23 + 0x10) = *(undefined8 *)(local_d0 + 4);
            *(undefined8 *)(pBVar23 + 0x18) = uVar8;
            if (0x20 < (long)uVar22) {
              lVar26 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_d0 + lVar26 + 0x20);
                uVar8 = puVar1[1];
                pBVar18 = pBVar23 + lVar26 + 0x20;
                *(undefined8 *)pBVar18 = *puVar1;
                *(undefined8 *)(pBVar18 + 8) = uVar8;
                puVar1 = (undefined8 *)((long)local_d0 + lVar26 + 0x30);
                uVar8 = puVar1[1];
                *(undefined8 *)(pBVar18 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar18 + 0x18) = uVar8;
                lVar26 = lVar26 + 0x20;
              } while (pBVar18 + 0x20 < pBVar23 + uVar22);
            }
          }
        }
        rep = local_90;
        psVar9 = local_b8;
        local_b8->lit = local_b8->lit + uVar22;
        if (0xffff < uVar22) {
          if (local_b8->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_b8->longLengthType = ZSTD_llt_literalLength;
          local_b8->longLengthPos =
               (U32)((ulong)((long)local_b8->sequences - (long)local_b8->sequencesStart) >> 3);
        }
        psVar4 = local_b8->sequences;
        psVar4->litLength = (U16)uVar22;
        psVar4->offBase = UVar6;
        if (uVar25 < 3) {
LAB_0016b024:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar25 - 3) {
          if (local_b8->longLengthType != ZSTD_llt_none) {
LAB_0016b081:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_b8->longLengthType = ZSTD_llt_matchLength;
          local_b8->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)local_b8->sequencesStart) >> 3);
        }
        psVar4->mlBase = (U16)(uVar25 - 3);
        local_b8->sequences = psVar4 + 1;
        if (ms->lazySkipping != 0) {
          uVar11 = ms->nextToUpdate;
          uVar22 = (ulong)uVar11;
          uVar10 = ((int)local_a8 - (int)(local_e8 + uVar22)) + 1;
          if (7 < uVar10) {
            uVar10 = 8;
          }
          if (local_a8 < local_e8 + uVar22) {
            uVar10 = 0;
          }
          if (uVar11 < uVar10 + uVar11) {
            if (0x20 < ms->rowHashLog + 8) goto LAB_0016b0bf;
            pUVar3 = ms->hashTable;
            pBVar23 = ms->tagTable;
            uVar13 = ms->hashSalt;
            cVar7 = (char)ms->rowHashLog;
            do {
              if (local_c4 == 5) {
                uVar24 = *(long *)(local_e8 + uVar22) * -0x30e4432345000000;
LAB_0016ad7b:
                uVar24 = (uVar24 ^ uVar13) >> (0x38U - cVar7 & 0x3f);
              }
              else {
                if (local_c4 == 6) {
                  uVar24 = *(long *)(local_e8 + uVar22) * -0x30e4432340650000;
                  goto LAB_0016ad7b;
                }
                uVar24 = (ulong)((*(int *)(local_e8 + uVar22) * -0x61c8864f ^ (uint)uVar13) >>
                                (0x18U - cVar7 & 0x1f));
              }
              uVar21 = ((uint)(uVar24 >> 8) & 0xffffff) << ((byte)local_f8 & 0x1f);
              if (((ulong)(pUVar3 + uVar21) & 0x3f) != 0) goto LAB_0016afc7;
              if ((local_48 & (ulong)(pBVar23 + uVar21)) != 0) goto LAB_0016afa8;
              ms->hashCache[(uint)uVar22 & 7] = (U32)uVar24;
              uVar22 = uVar22 + 1;
            } while (uVar10 + uVar11 != uVar22);
          }
          ms->lazySkipping = 0;
        }
        piVar29 = (int *)((long)local_d8 + uVar25);
        local_d0 = piVar29;
        do {
          if (local_a8 < piVar29) break;
          uVar11 = ((int)piVar29 - (int)local_e8) - uVar17;
          pBVar23 = local_e8;
          if (uVar11 < (uint)local_c0) {
            pBVar23 = local_70;
          }
          if ((uVar11 - (uint)local_c0 < 0xfffffffd) && (*(int *)(pBVar23 + uVar11) == *piVar29)) {
            piVar14 = iEnd;
            if (uVar11 < (uint)local_c0) {
              piVar14 = local_a0;
            }
            sVar12 = ZSTD_count_2segments
                               ((BYTE *)(piVar29 + 1),(BYTE *)((long)(pBVar23 + uVar11) + 4),
                                (BYTE *)iEnd,(BYTE *)piVar14,local_98);
            if (psVar9->maxNbSeq <=
                (ulong)((long)psVar9->sequences - (long)psVar9->sequencesStart >> 3))
            goto LAB_0016afe6;
            if (0x20000 < psVar9->maxNbLit) goto LAB_0016b005;
            pBVar23 = psVar9->lit;
            if (psVar9->litStart + psVar9->maxNbLit < pBVar23) goto LAB_0016b062;
            if (iEnd < local_d0) goto LAB_0016b043;
            if (local_78 < local_d0) {
              ZSTD_safecopyLiterals(pBVar23,(BYTE *)local_d0,(BYTE *)local_d0,(BYTE *)local_78);
            }
            else {
              uVar8 = *(undefined8 *)(local_d0 + 2);
              *(undefined8 *)pBVar23 = *(undefined8 *)local_d0;
              *(undefined8 *)(pBVar23 + 8) = uVar8;
            }
            psVar4 = psVar9->sequences;
            psVar4->litLength = 0;
            psVar4->offBase = 1;
            if (sVar12 + 4 < 3) goto LAB_0016b024;
            if (0xffff < sVar12 + 1) {
              if (psVar9->longLengthType != ZSTD_llt_none) goto LAB_0016b081;
              psVar9->longLengthType = ZSTD_llt_matchLength;
              psVar9->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)psVar9->sequencesStart) >> 3);
            }
            psVar4->mlBase = (U16)(sVar12 + 1);
            psVar9->sequences = psVar4 + 1;
            piVar29 = (int *)((long)piVar29 + sVar12 + 4);
            bVar5 = true;
            ms = local_f0;
            uVar11 = local_f4;
            local_f4 = uVar17;
            local_d0 = piVar29;
          }
          else {
            bVar5 = false;
            uVar11 = uVar17;
          }
          uVar17 = uVar11;
        } while (bVar5);
      }
    } while (piVar29 < local_a8);
  }
  *rep = local_f4;
  rep[1] = uVar17;
  return (long)iEnd - (long)local_d0;
}

Assistant:

size_t ZSTD_compressBlock_lazy_dedicatedDictSearch_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1, ZSTD_dedicatedDictSearch);
}